

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O3

void cleanuptypeinfo(rnntypeinfo *ti)

{
  long lVar1;
  
  if (0 < ti->bitfieldsnum) {
    lVar1 = 0;
    do {
      freebitfield(ti->bitfields[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < ti->bitfieldsnum);
  }
  free(ti->bitfields);
  if (0 < ti->valsnum) {
    lVar1 = 0;
    do {
      freevalue(ti->vals[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < ti->valsnum);
  }
  free(ti->vals);
  free(ti->name);
  return;
}

Assistant:

static void cleanuptypeinfo(struct rnntypeinfo *ti) {
	int i;
	for (i = 0; i < ti->bitfieldsnum; i++)
		freebitfield(ti->bitfields[i]);
	free(ti->bitfields);

	for (i = 0; i < ti->valsnum; i++)
		freevalue(ti->vals[i]);
	free(ti->vals);

	free(ti->name);
}